

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::MessageDifferencer::CompareRepeatedField
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          FieldDescriptor *repeated_field,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  bool bVar1;
  LogMessageFatal local_40 [16];
  
  bVar1 = FieldDescriptor::is_map(repeated_field);
  if (!bVar1) {
    bVar1 = CompareRepeatedRep(this,message1,message2,unpacked_any,repeated_field,parent_fields);
    return bVar1;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/util/message_differencer.cc"
             ,0x4c5,0x19,"!repeated_field->is_map()");
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
}

Assistant:

bool MessageDifferencer::CompareRepeatedField(
    const Message& message1, const Message& message2, int unpacked_any,
    const FieldDescriptor* repeated_field,
    std::vector<SpecificField>* parent_fields) {
  ABSL_DCHECK(!repeated_field->is_map());
  return CompareRepeatedRep(message1, message2, unpacked_any, repeated_field,
                            parent_fields);
}